

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O0

FloatRect __thiscall sf::Transform::transformRect(Transform *this,FloatRect *rectangle)

{
  Transform *in_RDI;
  int i;
  float bottom;
  float right;
  float top;
  float left;
  Vector2f points [4];
  int local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  Vector2f local_48;
  Vector2f local_40;
  Vector2f local_38;
  Vector2f local_30;
  FloatRect local_10;
  
  local_48 = transformPoint(in_RDI,0.0,4.126916e-39);
  local_40 = transformPoint(in_RDI,0.0,4.12697e-39);
  local_38 = transformPoint(in_RDI,0.0,4.127023e-39);
  local_30 = transformPoint(in_RDI,0.0,4.127089e-39);
  local_4c = local_48.x;
  local_50 = local_48.y;
  local_54 = local_48.x;
  local_58 = local_48.y;
  for (local_5c = 1; local_5c < 4; local_5c = local_5c + 1) {
    if (local_4c <= (&local_48)[local_5c].x) {
      if (local_54 < (&local_48)[local_5c].x) {
        local_54 = (&local_48)[local_5c].x;
      }
    }
    else {
      local_4c = (&local_48)[local_5c].x;
    }
    if (local_50 <= (&local_48)[local_5c].y) {
      if (local_58 < (&local_48)[local_5c].y) {
        local_58 = (&local_48)[local_5c].y;
      }
    }
    else {
      local_50 = (&local_48)[local_5c].y;
    }
  }
  Rect<float>::Rect(&local_10,local_4c,local_50,local_54 - local_4c,local_58 - local_50);
  return local_10;
}

Assistant:

FloatRect Transform::transformRect(const FloatRect& rectangle) const
{
    // Transform the 4 corners of the rectangle
    const Vector2f points[] =
    {
        transformPoint(rectangle.left, rectangle.top),
        transformPoint(rectangle.left, rectangle.top + rectangle.height),
        transformPoint(rectangle.left + rectangle.width, rectangle.top),
        transformPoint(rectangle.left + rectangle.width, rectangle.top + rectangle.height)
    };

    // Compute the bounding rectangle of the transformed points
    float left = points[0].x;
    float top = points[0].y;
    float right = points[0].x;
    float bottom = points[0].y;
    for (int i = 1; i < 4; ++i)
    {
        if      (points[i].x < left)   left = points[i].x;
        else if (points[i].x > right)  right = points[i].x;
        if      (points[i].y < top)    top = points[i].y;
        else if (points[i].y > bottom) bottom = points[i].y;
    }

    return FloatRect(left, top, right - left, bottom - top);
}